

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spell.cpp
# Opt level: O2

void Handlers::Spell_Target_Group(Character *character,PacketReader *reader)

{
  byte bVar1;
  World *pWVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  mapped_type *this;
  ESF_Data *pEVar6;
  int iVar7;
  int iVar8;
  allocator<char> local_41;
  key_type local_40;
  
  PacketReader::GetShort(reader);
  uVar4 = PacketReader::GetThree(reader);
  iVar8 = (int)uVar4 % 0x83d600;
  if ((character->spell_event == (TimeEvent *)0x0) && (character->spell_ready != true)) {
    return;
  }
  character->spell_target = TargetGroup;
  character->spell_target_id = 0;
  pWVar2 = character->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EnforceTimestamps",&local_41);
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar2->config,&local_40);
  bVar3 = util::variant::GetBool(this);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar3) {
    pEVar6 = ESF::Get(character->world->esf,(uint)character->spell_id);
    iVar5 = (character->timestamp).ts;
    iVar7 = iVar5;
    if ((iVar8 != -1) && (iVar7 = iVar8, iVar5 != -1)) {
      iVar7 = (iVar8 - iVar5) + 0x83d600;
      if (iVar5 <= iVar8) {
        iVar7 = iVar8 - iVar5;
      }
    }
    bVar1 = pEVar6->cast_time;
    if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar7) {
      iVar7 = iVar5;
      if ((iVar8 != -1) && (iVar7 = iVar8, iVar5 != -1)) {
        iVar7 = (iVar8 - iVar5) + 0x83d600;
        if (iVar5 <= iVar8) {
          iVar7 = iVar8 - iVar5;
        }
      }
      iVar5 = 0x32;
      if (bVar1 != 0) {
        iVar5 = (uint)bVar1 * 0x32;
      }
      if (iVar7 <= iVar5) goto LAB_00150471;
    }
    Character::CancelSpell(character);
  }
  else {
LAB_00150471:
    (character->timestamp).ts = iVar8;
    if (character->spell_ready == true) {
      Character::SpellAct(character);
    }
  }
  return;
}

Assistant:

void Spell_Target_Group(Character *character, PacketReader &reader)
{
	/*unsigned short spell_id = */reader.GetShort();
	Timestamp timestamp = reader.GetThree();

	if (!character->spell_event && !character->spell_ready)
		return;

	character->spell_target = Character::TargetGroup;
	character->spell_target_id = 0;

	if (character->world->config["EnforceTimestamps"])
	{
		const ESF_Data& spell = character->world->esf->Get(character->spell_id);

		if (timestamp - character->timestamp < (spell.cast_time - 1) * 47 + 35
		 || timestamp - character->timestamp > std::max<int>(spell.cast_time, 1) * 50)
		{
			character->CancelSpell();
			return;
		}
	}

	character->timestamp = timestamp;

	if (character->spell_ready)
		character->SpellAct();
}